

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImPlotRange *pIVar1;
  double dVar2;
  ImVec2 IVar3;
  double dVar4;
  int iVar5;
  ImU32 IVar6;
  uint uVar7;
  GetterXsYs<double> *pGVar8;
  TransformerLinLog *pTVar9;
  GetterXsYRef<double> *pGVar10;
  ImPlotPlot *pIVar11;
  ImDrawVert *pIVar12;
  ImDrawIdx *pIVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  long lVar19;
  ImDrawIdx IVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pIVar16 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  iVar18 = pGVar8->Count;
  lVar19 = (long)(((pGVar8->Offset + prim) % iVar18 + iVar18) % iVar18) * (long)pGVar8->Stride;
  dVar2 = *(double *)((long)pGVar8->Xs + lVar19);
  dVar22 = log10(*(double *)((long)pGVar8->Ys + lVar19) /
                 GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar9->YAxis;
  pIVar1 = &pIVar16->CurrentPlot->YAxis[iVar18].Range;
  dVar4 = pIVar1->Min;
  pGVar10 = this->Getter2;
  pTVar9 = this->Transformer;
  iVar5 = pGVar10->Count;
  IVar3 = pIVar16->PixelRange[iVar18].Min;
  fVar24 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)(dVar22 / pIVar16->LogDenY[iVar18]) * (pIVar1->Max - dVar4) +
                    dVar4) - dVar4) + (double)IVar3.y);
  fVar25 = (float)(pIVar16->Mx * (dVar2 - (pIVar16->CurrentPlot->XAxis).Range.Min) + (double)IVar3.x
                  );
  dVar2 = *(double *)
           ((long)pGVar10->Xs +
           (long)(((prim + pGVar10->Offset) % iVar5 + iVar5) % iVar5) * (long)pGVar10->Stride);
  dVar22 = log10(pGVar10->YRef / GImPlot->CurrentPlot->YAxis[pTVar9->YAxis].Range.Min);
  iVar18 = pTVar9->YAxis;
  pIVar11 = pIVar17->CurrentPlot;
  dVar4 = pIVar11->YAxis[iVar18].Range.Min;
  IVar3 = pIVar17->PixelRange[iVar18].Min;
  fVar21 = (float)(pIVar17->Mx * (dVar2 - (pIVar11->XAxis).Range.Min) + (double)IVar3.x);
  fVar23 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)(dVar22 / pIVar17->LogDenY[iVar18]) *
                     (pIVar11->YAxis[iVar18].Range.Max - dVar4) + dVar4) - dVar4) + (double)IVar3.y)
  ;
  auVar29._0_4_ = ~-(uint)(fVar21 <= fVar25) & (uint)fVar21;
  auVar29._4_4_ = ~-(uint)(fVar23 <= fVar24) & (uint)fVar23;
  auVar29._8_4_ = ~-(uint)(fVar25 < fVar21) & (uint)fVar21;
  auVar29._12_4_ = ~-(uint)(fVar24 < fVar23) & (uint)fVar23;
  auVar14._4_4_ = (uint)fVar24 & -(uint)(fVar23 <= fVar24);
  auVar14._0_4_ = (uint)fVar25 & -(uint)(fVar21 <= fVar25);
  auVar14._8_4_ = (uint)fVar25 & -(uint)(fVar25 < fVar21);
  auVar14._12_4_ = (uint)fVar24 & -(uint)(fVar24 < fVar23);
  auVar29 = auVar29 | auVar14;
  fVar26 = (cull_rect->Min).y;
  auVar31._4_4_ = -(uint)(fVar26 < auVar29._4_4_);
  auVar31._0_4_ = -(uint)((cull_rect->Min).x < auVar29._0_4_);
  auVar15._4_8_ = auVar29._8_8_;
  auVar15._0_4_ = -(uint)(auVar29._4_4_ < fVar26);
  auVar30._0_8_ = auVar15._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(auVar29._8_4_ < (cull_rect->Max).x);
  auVar30._12_4_ = -(uint)(auVar29._12_4_ < (cull_rect->Max).y);
  auVar31._8_8_ = auVar30._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar31);
  if (iVar18 == 0xf) {
    IVar6 = this->Col;
    IVar3 = *uv;
    fVar26 = fVar21 - fVar25;
    fVar27 = fVar23 - fVar24;
    fVar28 = fVar26 * fVar26 + fVar27 * fVar27;
    if (0.0 < fVar28) {
      fVar28 = 1.0 / SQRT(fVar28);
      fVar26 = fVar26 * fVar28;
      fVar27 = fVar27 * fVar28;
    }
    fVar28 = this->Weight * 0.5;
    pIVar12 = DrawList->_VtxWritePtr;
    fVar26 = fVar28 * fVar26;
    fVar28 = fVar28 * fVar27;
    (pIVar12->pos).x = fVar28 + fVar25;
    (pIVar12->pos).y = fVar24 - fVar26;
    (pIVar12->uv).x = IVar3.x;
    (pIVar12->uv).y = IVar3.y;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12->col = IVar6;
    pIVar12[1].pos.x = fVar28 + fVar21;
    pIVar12[1].pos.y = fVar23 - fVar26;
    pIVar12[1].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[1].col = IVar6;
    pIVar12[2].pos.x = fVar21 - fVar28;
    pIVar12[2].pos.y = fVar23 + fVar26;
    pIVar12[2].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[2].col = IVar6;
    pIVar12[3].pos.x = fVar25 - fVar28;
    pIVar12[3].pos.y = fVar26 + fVar24;
    pIVar12[3].uv = IVar3;
    pIVar12 = DrawList->_VtxWritePtr;
    pIVar12[3].col = IVar6;
    DrawList->_VtxWritePtr = pIVar12 + 4;
    uVar7 = DrawList->_VtxCurrentIdx;
    pIVar13 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar7;
    *pIVar13 = IVar20;
    pIVar13[1] = IVar20 + 1;
    pIVar13[2] = IVar20 + 2;
    pIVar13[3] = IVar20;
    pIVar13[4] = IVar20 + 2;
    pIVar13[5] = IVar20 + 3;
    DrawList->_IdxWritePtr = pIVar13 + 6;
    DrawList->_VtxCurrentIdx = uVar7 + 4;
  }
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }